

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

bool __thiscall
VolumeFile::decryptData(VolumeFile *this,uint8_t *data,uint64_t dataSize,uint32_t seed)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (dataSize != 0 && data != (uint8_t *)0x0) {
    iVar1 = (*this->_vptr_VolumeFile[2])();
    Keyset::cryptBytes<unsigned_char*,unsigned_char*,void>
              ((Keyset *)CONCAT44(extraout_var,iVar1),data,data + dataSize,data,seed);
  }
  return data != (uint8_t *)0x0;
}

Assistant:

bool VolumeFile::decryptData(uint8_t* data, uint64_t dataSize, uint32_t seed) const
{
	if (!data) {
		return false;
	}

	if (dataSize > 0) {
		const auto& keyset = getKeyset();
		keyset.cryptBytes(data, data + dataSize, data, seed);
	}

	return true;
}